

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_RangeDouble_Test::TestBody(TApp_RangeDouble_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  Option *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  allocator local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  iterator local_1f8;
  size_type local_1f0;
  undefined1 local_1e2;
  allocator local_1e1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  iterator local_1b8;
  size_type local_1b0;
  undefined1 local_1a2;
  allocator local_1a1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  iterator local_178;
  size_type local_170;
  AssertHelper local_168;
  Message local_160 [2];
  ValidationError *anon_var_0_1;
  char *pcStack_148;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  iterator local_110;
  size_type local_108;
  AssertHelper local_100;
  Message local_f8 [2];
  ValidationError *anon_var_0;
  char *pcStack_e0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  iterator local_a8;
  size_type local_a0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  double local_18;
  double x;
  TApp_RangeDouble_Test *this_local;
  
  local_18 = 0.0;
  x = (double)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--one",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",&local_71);
  this_00 = CLI::App::add_option<double,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_38,&local_18,&local_70);
  CLI::Range<double>(&local_98,3.0,6.0);
  CLI::Option::check(this_00,&local_98);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"--one=1",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_a8 = &local_c8;
  local_a0 = 1;
  __l_03._M_len = 1;
  __l_03._M_array = local_a8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_03);
  local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
  do {
    local_268 = local_268 + -1;
    std::__cxx11::string::~string((string *)local_268);
  } while (local_268 != &local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff20);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_e0 = 
      "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
      ;
      goto LAB_0014d14d;
    }
  }
  else {
LAB_0014d14d:
    testing::Message::Message(local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x4b6,pcStack_e0);
    testing::internal::AssertHelper::operator=(&local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(local_f8);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg_1.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,"--one=7",(allocator *)((long)&gtest_msg_1.value + 7));
  gtest_msg_1.value._6_1_ = 0;
  local_110 = &local_130;
  local_108 = 1;
  __l_02._M_len = 1;
  __l_02._M_array = local_110;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
  do {
    local_2c0 = local_2c0 + -1;
    std::__cxx11::string::~string((string *)local_2c0);
  } while (local_2c0 != &local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg_1.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffeb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffeb8);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_0014d51c;
    pcStack_148 = 
    "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_160);
  testing::internal::AssertHelper::AssertHelper
            (&local_168,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4ba,pcStack_148);
  testing::internal::AssertHelper::operator=(&local_168,local_160);
  testing::internal::AssertHelper::~AssertHelper(&local_168);
  testing::Message::~Message(local_160);
LAB_0014d51c:
  CLI::App::reset(&(this->super_TApp).app);
  local_1a2 = '\x01';
  local_1a1._1_8_ = &local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,"--one=3",local_1a1);
  local_1a2 = '\0';
  local_178 = &local_198;
  local_170 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_178;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_01);
  local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178;
  do {
    local_318 = local_318 + -1;
    std::__cxx11::string::~string((string *)local_318);
  } while (local_318 != &local_198);
  std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_1e2 = '\x01';
  local_1e1._1_8_ = &local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"--one=5",local_1e1);
  local_1e2 = '\0';
  local_1b8 = &local_1d8;
  local_1b0 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_1b8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_00);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8;
  do {
    local_340 = local_340 + -1;
    std::__cxx11::string::~string((string *)local_340);
  } while (local_340 != &local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)local_1e1);
  TApp::run(&this->super_TApp);
  CLI::App::reset(&(this->super_TApp).app);
  local_220 = &local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"--one=6",&local_221);
  local_1f8 = &local_218;
  local_1f0 = 1;
  __l._M_len = 1;
  __l._M_array = local_1f8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8;
  do {
    local_368 = local_368 + -1;
    std::__cxx11::string::~string((string *)local_368);
  } while (local_368 != &local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RangeDouble) {

    double x = 0;
    /// Note that this must be a double in Range, too
    app.add_option("--one", x)->check(CLI::Range(3.0, 6.0));

    args = {"--one=1"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=7"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=3"};
    run();

    app.reset();
    args = {"--one=5"};
    run();

    app.reset();
    args = {"--one=6"};
    run();
}